

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

AttVal * ParseAttrs(TidyDocImpl *doc,Bool *isempty)

{
  StreamIn *in;
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  tmbstr name;
  tmbstr ptVar8;
  AttVal *pAVar9;
  AttVal *pAVar10;
  Attribute *pAVar11;
  uint code;
  AttVal *pAVar12;
  ulong uVar13;
  AttVal *pAVar14;
  int delim;
  Node *php;
  Node *asp;
  int local_4c;
  Lexer *local_48;
  Node *local_40;
  Node *local_38;
  
  local_48 = doc->lexer;
  pAVar14 = (AttVal *)0x0;
  do {
    in = doc->docIn;
    if (in == (StreamIn *)0x0) {
      __assert_fail("doc->docIn != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/lexer.c"
                    ,0x38f,"Bool EndOfInput(TidyDocImpl *)");
    }
    if ((in->pushed == no) && (BVar5 = prvTidyIsEOF(in), BVar5 != no)) {
      return pAVar14;
    }
    name = ParseAttribute(doc,isempty,&local_38,&local_40);
    pNVar4 = local_38;
    pNVar3 = local_40;
    if (name == (tmbstr)0x0) {
      if (local_38 == (Node *)0x0) {
        if (local_40 != (Node *)0x0) {
          pAVar10 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
          pAVar10->asp = (Node *)0x0;
          pAVar10->php = (Node *)0x0;
          pAVar10->next = (AttVal *)0x0;
          pAVar10->dict = (Attribute *)0x0;
          *(undefined8 *)&pAVar10->delim = 0;
          pAVar10->attribute = (tmbstr)0x0;
          pAVar10->value = (tmbstr)0x0;
          pAVar10->php = pNVar3;
          pAVar9 = pAVar14;
          if (pAVar14 == (AttVal *)0x0) goto LAB_0014bc4a;
          do {
            pAVar12 = pAVar9;
            pAVar9 = pAVar12->next;
          } while (pAVar12->next != (AttVal *)0x0);
          goto LAB_0014bc43;
        }
        bVar1 = true;
      }
      else {
        pAVar10 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
        pAVar10->asp = (Node *)0x0;
        pAVar10->php = (Node *)0x0;
        pAVar10->next = (AttVal *)0x0;
        pAVar10->dict = (Attribute *)0x0;
        *(undefined8 *)&pAVar10->delim = 0;
        pAVar10->attribute = (tmbstr)0x0;
        pAVar10->value = (tmbstr)0x0;
        pAVar10->asp = pNVar4;
        pAVar9 = pAVar14;
        if (pAVar14 == (AttVal *)0x0) {
LAB_0014bc4a:
          bVar1 = false;
          pAVar14 = pAVar10;
        }
        else {
          do {
            pAVar12 = pAVar9;
            pAVar9 = pAVar12->next;
          } while (pAVar12->next != (AttVal *)0x0);
LAB_0014bc43:
          pAVar12->next = pAVar10;
          bVar1 = false;
        }
      }
    }
    else {
      ptVar8 = ParseValue(doc,name,no,isempty,&local_4c);
      if (((long)*name < 0) || ((lexmap[*name] & 2) == 0)) {
LAB_0014ba27:
        if ((*(int *)((doc->config).value + 0x67) != 0) &&
           (BVar5 = prvTidyIsValidXMLID(name), BVar5 != no)) goto LAB_0014bb50;
        pAVar9 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
        *(undefined8 *)&pAVar9->delim = 0;
        pAVar9->attribute = (tmbstr)0x0;
        pAVar9->next = (AttVal *)0x0;
        pAVar9->dict = (Attribute *)0x0;
        pAVar9->asp = (Node *)0x0;
        pAVar9->php = (Node *)0x0;
        pAVar9->attribute = name;
        pAVar9->value = ptVar8;
        if (*name == '\0') {
LAB_0014ba88:
          code = 0x248;
          if (ptVar8 == (tmbstr)0x0) {
            code = 0x256;
          }
        }
        else {
          uVar6 = prvTidytmbstrlen(name);
          code = 0x25d;
          if (name[(long)(int)uVar6 + -1] != '\"') goto LAB_0014ba88;
        }
        prvTidyReportAttrError(doc,local_48->token,pAVar9,code);
        prvTidyFreeAttribute(doc,pAVar9);
      }
      else {
        uVar6 = prvTidytmbstrlen(name);
        if (1 < uVar6) {
          uVar13 = 1;
          do {
            if (((long)name[uVar13] < 0) || ((lexmap[name[uVar13]] & 4) == 0)) goto LAB_0014ba27;
            uVar13 = uVar13 + 1;
            uVar6 = prvTidytmbstrlen(name);
          } while (uVar13 < uVar6);
        }
LAB_0014bb50:
        pAVar9 = (AttVal *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x38);
        iVar2 = local_4c;
        pAVar9->next = (AttVal *)0x0;
        pAVar9->dict = (Attribute *)0x0;
        pAVar9->asp = (Node *)0x0;
        pAVar9->php = (Node *)0x0;
        *(undefined8 *)&pAVar9->delim = 0;
        pAVar9->attribute = (tmbstr)0x0;
        pAVar9->value = (tmbstr)0x0;
        iVar7 = local_4c;
        if (local_4c == 0) {
          iVar7 = 0x22;
        }
        pAVar9->delim = iVar7;
        pAVar9->attribute = name;
        pAVar9->value = ptVar8;
        pAVar11 = prvTidyFindAttribute(doc,pAVar9);
        pAVar9->dict = pAVar11;
        pAVar10 = pAVar14;
        pAVar12 = pAVar9;
        if (pAVar14 != (AttVal *)0x0) {
          do {
            pAVar12 = pAVar10;
            pAVar10 = pAVar12->next;
          } while (pAVar10 != (AttVal *)0x0);
          pAVar12->next = pAVar9;
          pAVar12 = pAVar14;
        }
        pAVar14 = pAVar12;
        if (ptVar8 != (tmbstr)0x0 && iVar2 == 0) {
          prvTidyReportAttrError(doc,local_48->token,pAVar9,0x25e);
        }
      }
      bVar1 = false;
    }
    if (bVar1) {
      return pAVar14;
    }
  } while( true );
}

Assistant:

static AttVal* ParseAttrs( TidyDocImpl* doc, Bool *isempty )
{
    Lexer* lexer = doc->lexer;
    AttVal *av, *list;
    tmbstr value;
    int delim;
    Node *asp, *php;

    list = NULL;

    while ( !EndOfInput(doc) )
    {
        tmbstr attribute = ParseAttribute( doc, isempty, &asp, &php );

        if (attribute == NULL)
        {
            /* check if attributes are created by ASP markup */
            if (asp)
            {
                av = TY_(NewAttribute)(doc);
                av->asp = asp;
                AddAttrToList( &list, av ); 
                continue;
            }

            /* check if attributes are created by PHP markup */
            if (php)
            {
                av = TY_(NewAttribute)(doc);
                av->php = php;
                AddAttrToList( &list, av ); 
                continue;
            }

            break;
        }

        value = ParseValue( doc, attribute, no, isempty, &delim );

        if (attribute && (IsValidAttrName(attribute) ||
            (cfgBool(doc, TidyXmlTags) && IsValidXMLAttrName(attribute))))
        {
            av = TY_(NewAttribute)(doc);
            av->delim = delim ? delim : '"';
            av->attribute = attribute;
            av->value = value;
            av->dict = TY_(FindAttribute)( doc, av );
            AddAttrToList( &list, av );
            if ( !delim && value )
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK_OPEN);
        }
        else
        {
            av = TY_(NewAttribute)(doc);
            av->attribute = attribute;
            av->value = value;

            if (LastChar(attribute) == '"')
                TY_(ReportAttrError)( doc, lexer->token, av, MISSING_QUOTEMARK);
            else if (value == NULL)
                TY_(ReportAttrError)(doc, lexer->token, av, MISSING_ATTR_VALUE);
            else
                TY_(ReportAttrError)(doc, lexer->token, av, INVALID_ATTRIBUTE);

            TY_(FreeAttribute)( doc, av );
        }
    }

    return list;
}